

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkPerModifications(string *unit_string,uint64_t match_flags)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  precise_unit pVar4;
  string local_70;
  string local_50;
  
  if (((uint)match_flags >> 0x15 & 1) == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"per","");
    sVar2 = findWordOperatorSep(unit_string,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 != 0xffffffffffffffff) {
      if (sVar2 == 0) {
        pcVar3 = "1/";
        sVar2 = 0;
      }
      else {
        pcVar3 = "/";
      }
      std::__cxx11::string::replace((ulong)unit_string,sVar2,(char *)0x3,(ulong)pcVar3);
      pcVar1 = (unit_string->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
      pVar4 = unit_from_string_internal(&local_70,match_flags + 0x80000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pVar4._8_8_ & 0xffffffff) != 0xfa94a488 && !NAN(pVar4.multiplier_)) {
        return pVar4;
      }
    }
  }
  pVar4.base_units_ = (unit_data)0xfa94a488;
  pVar4.commodity_ = 0;
  pVar4.multiplier_ = NAN;
  return pVar4;
}

Assistant:

static precise_unit
    checkPerModifications(std::string unit_string, std::uint64_t match_flags)
{
    // try changing out any "per" words for division sign
    if ((match_flags & no_per_operators) == 0) {
        auto fnd = findWordOperatorSep(unit_string, "per");
        if (fnd != std::string::npos) {
            if (fnd == 0) {
                unit_string.replace(fnd, 3, "1/");
            } else {
                unit_string.replace(fnd, 3, "/");
            }
            auto retunit = unit_from_string_internal(
                unit_string, match_flags + per_operator1);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}